

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O2

int __thiscall
ncnn::Yolov3DetectionOutput::forward
          (Yolov3DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined4 uVar1;
  undefined8 uVar2;
  pointer pMVar3;
  void *pvVar4;
  uint uVar5;
  undefined1 auVar6 [12];
  int iVar7;
  undefined4 *puVar8;
  long lVar9;
  Mat *pMVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  Yolov3DetectionOutput *this_00;
  int q;
  int iVar15;
  int i;
  ulong uVar16;
  size_t i_2;
  float *pfVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar26;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  float *local_1e0;
  float *local_1d8;
  float *local_1d0;
  float *local_1c8;
  vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
  all_box_bbox_rects;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  int local_fc;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  float fStack_50;
  float fStack_4c;
  
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_bbox_rects.
  super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar14 = 0;
  do {
    if ((ulong)(((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start) / 0x48) <= uVar14) {
      this_00 = this;
      qsort_descent_inplace(this,&all_bbox_rects);
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nms_sorted_bboxes(this_00,&all_bbox_rects,&picked,this->nms_threshold);
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0.0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0.0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0.0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0.0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0.0;
      bbox_rects.
      super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0.0;
      for (uVar14 = 0;
          uVar14 < (ulong)((long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)picked.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 3); uVar14 = uVar14 + 1
          ) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
        ::push_back(&bbox_rects,
                    all_bbox_rects.
                    super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                    ._M_impl.super__Vector_impl_data._M_start +
                    picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar14]);
      }
      uVar14 = (CONCAT44(bbox_rects.
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                         bbox_rects.
                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                         ._M_impl.super__Vector_impl_data._M_finish._0_4_) -
               CONCAT44(bbox_rects.
                        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_,
                        bbox_rects.
                        super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_4_)) / 0x1c;
      iVar15 = (int)uVar14;
      if (iVar15 == 0) {
        iVar7 = 0;
      }
      else {
        pMVar10 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        Mat::create(pMVar10,6,iVar15,4,opt->blob_allocator);
        pvVar4 = pMVar10->data;
        iVar7 = -100;
        if ((pvVar4 != (void *)0x0) && ((long)pMVar10->c * pMVar10->cstep != 0)) {
          puVar8 = (undefined4 *)
                   CONCAT44(bbox_rects.
                            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            bbox_rects.
                            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
          iVar7 = 0;
          uVar14 = uVar14 & 0xffffffff;
          if (iVar15 < 1) {
            uVar14 = 0;
          }
          for (uVar16 = 0; uVar14 != uVar16; uVar16 = uVar16 + 1) {
            uVar1 = *puVar8;
            lVar12 = (long)pMVar10->w * uVar16 * pMVar10->elemsize;
            *(float *)((long)pvVar4 + lVar12) = (float)(puVar8[6] + 1);
            *(undefined4 *)((long)pvVar4 + lVar12 + 4) = uVar1;
            *(undefined4 *)((long)pvVar4 + lVar12 + 8) = puVar8[1];
            *(undefined4 *)((long)pvVar4 + lVar12 + 0xc) = puVar8[2];
            *(undefined4 *)((long)pvVar4 + lVar12 + 0x10) = puVar8[3];
            *(undefined4 *)((long)pvVar4 + lVar12 + 0x14) = puVar8[4];
            puVar8 = puVar8 + 7;
          }
        }
      }
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
LAB_0027eb59:
      std::
      _Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
      ::~_Vector_base(&all_bbox_rects.
                       super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                     );
      return iVar7;
    }
    all_box_bbox_rects.
    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    all_box_bbox_rects.
    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    all_box_bbox_rects.
    super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::resize(&all_box_bbox_rects,(long)this->num_box);
    pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar15 = this->num_box;
    iVar7 = pMVar3[uVar14].c / iVar15;
    if (iVar7 != this->num_class + 5) {
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector(&all_box_bbox_rects);
      iVar7 = -1;
      goto LAB_0027eb59;
    }
    pMVar10 = pMVar3 + uVar14;
    lVar12 = (long)iVar15;
    uVar16._0_4_ = pMVar10->w;
    uVar16._4_4_ = pMVar10->h;
    auVar27._0_4_ = (float)(int)(undefined4)uVar16;
    auVar27._4_4_ = (float)(int)uVar16._4_4_;
    fVar18 = *(float *)((long)(this->anchors_scale).data + uVar14 * 4);
    uVar13 = uVar16 & 0xffffffff;
    if ((int)(undefined4)uVar16 < 1) {
      uVar13 = 0;
    }
    uVar5 = uVar16._4_4_;
    if ((int)uVar16._4_4_ < 1) {
      uVar5 = 0;
    }
    auVar24._0_4_ = (float)(int)(fVar18 * auVar27._0_4_);
    auVar24._4_4_ = (float)(int)(fVar18 * auVar27._4_4_);
    auVar24._8_4_ = (float)(int)(fVar18 * 0.0);
    auVar24._12_4_ = (float)(int)(fVar18 * 0.0);
    auVar27._8_8_ = 0x3f0000003f000000;
    auVar25 = rcpps(auVar24,auVar27);
    fVar18 = auVar25._0_4_;
    fVar26 = auVar25._4_4_;
    for (lVar9 = 0; lVar9 < iVar15; lVar9 = lVar9 + 1) {
      iVar15 = (int)lVar9 * iVar7;
      uVar2 = *(undefined8 *)
               ((long)(this->biases).data +
               (long)((int)*(float *)((long)(this->mask).data + lVar9 * 4 + lVar12 * uVar14 * 4) * 2
                     ) * 4);
      Mat::channel((Mat *)&picked,pMVar10,iVar15);
      local_1c8 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel((Mat *)&picked,pMVar10,iVar15 + 1);
      local_1d0 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel((Mat *)&picked,pMVar10,iVar15 + 2);
      local_1d8 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel((Mat *)&picked,pMVar10,iVar15 + 3);
      local_1e0 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel((Mat *)&picked,pMVar10,iVar15 + 4);
      pfVar17 = (float *)picked.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      Mat::~Mat((Mat *)&picked);
      Mat::channel_range((Mat *)&picked,pMVar10,iVar15 + 5,this->num_class);
      for (uVar16 = 0; uVar16 != uVar5; uVar16 = uVar16 + 1) {
        for (uVar11 = 0; uVar11 != uVar13; uVar11 = uVar11 + 1) {
          _local_208 = ZEXT812(0xff7fffff);
          fStack_1fc = 0.0;
          for (iVar15 = 0; iVar15 < this->num_class; iVar15 = iVar15 + 1) {
            Mat::channel((Mat *)&bbox_rects,(Mat *)&picked,iVar15);
            fVar19 = *(float *)((long)local_fc * uVar16 *
                                CONCAT44(bbox_rects.
                                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                         bbox_rects.
                                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) +
                                CONCAT44(bbox_rects.
                                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                         bbox_rects.
                                         super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                               uVar11 * 4);
            Mat::~Mat((Mat *)&bbox_rects);
            if ((float)local_208._0_4_ <= fVar19) {
              local_208._0_4_ = fVar19;
            }
          }
          fVar19 = expf(-*pfVar17);
          fVar20 = expf(-(float)local_208._0_4_);
          fVar19 = 1.0 / ((fVar20 + 1.0) * fVar19 + 1.0);
          if (this->confidence_threshold <= fVar19) {
            fVar20 = *local_1d0;
            auVar25 = ZEXT416((uint)fVar20);
            fVar21 = expf(-*local_1c8);
            fVar20 = expf(-fVar20);
            local_208._4_4_ = fVar20 + 1.0;
            local_208._0_4_ = fVar21 + 1.0;
            fStack_200 = extraout_XMM0_Db + 0.0;
            fStack_1fc = extraout_XMM0_Db_00 + 0.0;
            fVar22 = expf(*local_1d8);
            fVar23 = expf(*local_1e0);
            auVar25 = rcpps(auVar25,_local_208);
            fStack_50 = (float)uVar2;
            fStack_4c = (float)((ulong)uVar2 >> 0x20);
            auVar29._0_4_ = auVar25._0_4_ * 1.0;
            auVar29._4_4_ = auVar25._4_4_ * 1.0;
            auVar29._8_4_ = fStack_50 * auVar25._8_4_;
            auVar29._12_4_ = fStack_4c * auVar25._12_4_;
            auVar6._4_8_ = auVar25._8_8_;
            auVar6._0_4_ = (float)(int)uVar16;
            auVar30._0_8_ = auVar6._0_8_ << 0x20;
            auVar30._8_4_ = auVar24._0_4_;
            auVar30._12_4_ = auVar24._4_4_;
            auVar28._4_12_ = auVar30._4_12_;
            auVar28._0_4_ = (float)(int)uVar11;
            auVar30 = rcpps(auVar29,auVar28);
            fVar31 = fVar22 * fStack_50 * auVar30._8_4_;
            fVar32 = fVar23 * fStack_4c * auVar30._12_4_;
            fVar31 = (fVar22 * fStack_50 - auVar24._0_4_ * fVar31) * auVar30._8_4_ + fVar31;
            fVar32 = (fVar23 * fStack_4c - auVar24._4_4_ * fVar32) * auVar30._12_4_ + fVar32;
            fVar21 = ((1.0 - (fVar21 + 1.0) * auVar29._0_4_) * auVar25._0_4_ + auVar29._0_4_ +
                     auVar28._0_4_) * ((1.0 - auVar27._0_4_ * fVar18) * fVar18 + fVar18);
            fVar20 = ((1.0 - (fVar20 + 1.0) * auVar29._4_4_) * auVar25._4_4_ + auVar29._4_4_ +
                     (float)(int)uVar16) * ((1.0 - auVar27._4_4_ * fVar26) * fVar26 + fVar26);
            fVar22 = fVar31 * 0.5;
            fVar23 = fVar32 * 0.5;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = fVar21 - fVar22;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_4_ = fVar20 - fVar23;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_finish._4_4_ = fVar21 + fVar22;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = fVar20 + fVar23;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = fVar31 * fVar32;
            bbox_rects.
            super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = fVar19;
            std::
            vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
            ::push_back(all_box_bbox_rects.
                        super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar9,(value_type *)&bbox_rects)
            ;
          }
          local_1c8 = local_1c8 + 1;
          local_1d0 = local_1d0 + 1;
          local_1d8 = local_1d8 + 1;
          local_1e0 = local_1e0 + 1;
          pfVar17 = pfVar17 + 1;
        }
      }
      Mat::~Mat((Mat *)&picked);
      iVar15 = this->num_box;
    }
    lVar12 = 8;
    for (lVar9 = 0; lVar9 < iVar15; lVar9 = lVar9 + 1) {
      std::
      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
      ::
      insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>,void>
                ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                  *)&all_bbox_rects,
                 (const_iterator)
                 all_bbox_rects.
                 super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 *(BBoxRect **)
                  ((long)all_box_bbox_rects.
                         super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar12 + -8),
                 *(BBoxRect **)
                  ((long)&((all_box_bbox_rects.
                            super__Vector_base<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->
                          super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar12));
      iVar15 = this->num_box;
      lVar12 = lVar12 + 0x18;
    }
    std::
    vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
    ::~vector(&all_box_bbox_rects);
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

int Yolov3DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
        //printf("%d %d\n", net_w, net_h);

        //printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}